

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.h
# Opt level: O2

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::InitFrom(EpsCopyInputStream *this,StringPiece flat)

{
  size_t __n;
  char *__src;
  uintptr_t uVar1;
  char *__dest;
  
  __n = flat.length_;
  __src = flat.ptr_;
  this->overall_limit_ = 0;
  if ((long)__n < 0x11) {
    __dest = this->buffer_;
    memcpy(__dest,__src,__n);
    this->limit_ = 0;
    this->buffer_end_ = this->buffer_ + __n;
    this->limit_end_ = this->buffer_ + __n;
    this->next_chunk_ = (char *)0x0;
    if (this->aliasing_ != 1) {
      return __dest;
    }
    uVar1 = (long)__src - (long)__dest;
  }
  else {
    this->limit_ = 0x10;
    this->buffer_end_ = __src + (__n - 0x10);
    this->limit_end_ = __src + (__n - 0x10);
    this->next_chunk_ = this->buffer_;
    if (this->aliasing_ != 1) {
      return __src;
    }
    uVar1 = 2;
    __dest = __src;
  }
  this->aliasing_ = uVar1;
  return __dest;
}

Assistant:

const char* InitFrom(StringPiece flat) {
    overall_limit_ = 0;
    if (flat.size() > kSlopBytes) {
      limit_ = kSlopBytes;
      limit_end_ = buffer_end_ = flat.end() - kSlopBytes;
      next_chunk_ = buffer_;
      if (aliasing_ == kOnPatch) aliasing_ = kNoDelta;
      return flat.begin();
    } else {
      std::memcpy(buffer_, flat.begin(), flat.size());
      limit_ = 0;
      limit_end_ = buffer_end_ = buffer_ + flat.size();
      next_chunk_ = nullptr;
      if (aliasing_ == kOnPatch) {
        aliasing_ = reinterpret_cast<std::uintptr_t>(flat.data()) -
                    reinterpret_cast<std::uintptr_t>(buffer_);
      }
      return buffer_;
    }
  }